

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this)

{
  pointer pbVar1;
  
  pbVar1 = (this->LocalGenerator->super_cmLocalCommonGenerator).ConfigNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->LocalGenerator->super_cmLocalCommonGenerator).ConfigNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
    return __return_storage_ptr__;
  }
  __assert_fail("configNames.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefileTargetGenerator.cxx"
                ,0x73,"std::string cmMakefileTargetGenerator::GetConfigName() const");
}

Assistant:

std::string cmMakefileTargetGenerator::GetConfigName() const
{
  auto const& configNames = this->LocalGenerator->GetConfigNames();
  assert(configNames.size() == 1);
  return configNames.front();
}